

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void benchmark::anon_unknown_1::RunInThread
               (Instance *b,size_t iters,int thread_id,ThreadStats *total)

{
  char cVar1;
  mutex_type *pmVar2;
  int iVar3;
  Mutex *__m;
  MutexLock l;
  State st;
  CheckHandler local_90;
  CheckHandler local_88;
  unique_lock<std::mutex> local_80;
  State local_70;
  
  State::State(&local_70,iters,&b->arg,thread_id,b->threads);
  (*b->benchmark->_vptr_Benchmark[2])(b->benchmark,&local_70);
  if (local_70.total_iterations_ == local_70.max_iterations) {
    local_90.log_ = internal::GetNullLogInstance();
  }
  else {
    internal::CheckHandler::CheckHandler
              (&local_90,"st.iterations() == st.max_iterations",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
               ,"RunInThread",0x316);
  }
  std::operator<<(local_90.log_,"Benchmark returned before State::KeepRunning() returned false!");
  if (local_70.total_iterations_ != local_70.max_iterations) {
    internal::CheckHandler::~CheckHandler(&local_90);
  }
  __m = GetBenchmarkLock();
  std::unique_lock<std::mutex>::unique_lock(&local_80,&__m->mut_);
  total->bytes_processed = total->bytes_processed + local_70.bytes_processed_;
  total->items_processed = total->items_processed + local_70.items_processed_;
  total->complexity_n = total->complexity_n + local_70.complexity_n_;
  std::unique_lock<std::mutex>::~unique_lock(&local_80);
  pmVar2 = (anonymous_namespace)::timer_manager;
  std::unique_lock<std::mutex>::unique_lock(&local_80,(anonymous_namespace)::timer_manager);
  iVar3 = *(int *)((long)&pmVar2[3].super___mutex_base._M_mutex + 0x20) + 1;
  *(int *)((long)&pmVar2[3].super___mutex_base._M_mutex + 0x20) = iVar3;
  if (iVar3 == pmVar2[2].super___mutex_base._M_mutex.__data.__owner) {
    cVar1 = pmVar2[2].super___mutex_base._M_mutex.__size[0x18];
    if (cVar1 == '\0') {
      local_88.log_ = internal::GetNullLogInstance();
    }
    else {
      internal::CheckHandler::CheckHandler
                (&local_88,"!running_",
                 "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                 ,"Finalize",0xdb);
    }
    std::operator<<(local_88.log_,"The timer should be stopped before the timer is finalized");
    if (cVar1 != '\0') {
      internal::CheckHandler::~CheckHandler(&local_88);
    }
    Notification::Notify(*(Notification **)((long)&pmVar2[2].super___mutex_base._M_mutex + 0x10));
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_80);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_70.range_.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

EXCLUDES(GetBenchmarkLock()) {
  State st(iters, b->arg, thread_id, b->threads);
  b->benchmark->Run(st);
  CHECK(st.iterations() == st.max_iterations) <<
    "Benchmark returned before State::KeepRunning() returned false!";
  {
    MutexLock l(GetBenchmarkLock());
    total->bytes_processed += st.bytes_processed();
    total->items_processed += st.items_processed();
    total->complexity_n += st.complexity_length_n();
  }

  timer_manager->Finalize();
}